

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O1

Lazy<cinatra::resp_data> __thiscall
cinatra::coro_http_client::async_post
          (coro_http_client *this,string *uri,string *content,req_content_type content_type,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *headers)

{
  ulong *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type *psVar3;
  Handle HVar4;
  undefined4 in_register_0000000c;
  long *plVar5;
  req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> ctx;
  size_type *local_140;
  _Hash_node_base *local_138;
  uint local_130;
  undefined4 uStack_12c;
  float fStack_128;
  undefined4 uStack_124;
  ulong *local_120;
  undefined8 local_118;
  ulong local_110;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined8 local_100;
  size_type *local_f8;
  size_type local_f0;
  size_type local_e8;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  string *local_d8;
  Handle local_d0;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  ulong local_90;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  plVar5 = (long *)CONCAT44(in_register_0000000c,content_type);
  local_140 = (size_type *)&local_130;
  local_d8 = uri;
  local_d0.__handle_ = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"");
  puVar1 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar1) {
    local_110 = *puVar1;
    uStack_108 = (undefined4)plVar5[3];
    uStack_104 = *(undefined4 *)((long)plVar5 + 0x1c);
    local_120 = &local_110;
  }
  else {
    local_110 = *puVar1;
    local_120 = (ulong *)*plVar5;
  }
  local_c8._M_h._M_single_bucket = (__node_base_ptr)plVar5[1];
  *plVar5 = (long)puVar1;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_100 = 0;
  local_f8 = (size_type *)(content->_M_dataplus)._M_p;
  paVar2 = &content->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8 == paVar2) {
    local_e8 = paVar2->_M_allocated_capacity;
    uStack_e0 = *(undefined4 *)((long)&content->field_2 + 8);
    uStack_dc = *(undefined4 *)((long)&content->field_2 + 0xc);
    local_f8 = &local_e8;
  }
  else {
    local_e8 = paVar2->_M_allocated_capacity;
  }
  local_f0 = content->_M_string_length;
  (content->_M_dataplus)._M_p = (pointer)paVar2;
  content->_M_string_length = 0;
  (content->field_2)._M_local_buf[0] = '\0';
  psVar3 = &local_c8._M_h._M_element_count;
  if (local_140 == (size_type *)&local_130) {
    local_c8._M_h._M_rehash_policy._M_max_load_factor = fStack_128;
    local_c8._M_h._M_rehash_policy._4_4_ = uStack_124;
    local_c8._M_h._M_bucket_count = (size_type)psVar3;
  }
  else {
    local_c8._M_h._M_bucket_count = (size_type)local_140;
  }
  local_c8._M_h._M_element_count = CONCAT44(uStack_12c,local_130);
  local_c8._M_h._M_before_begin._M_nxt = local_138;
  local_138 = (_Hash_node_base *)0x0;
  local_130 = local_130 & 0xffffff00;
  if (local_120 == &local_110) {
    uStack_88 = uStack_108;
    uStack_84 = uStack_104;
    local_c8._M_h._M_rehash_policy._M_next_resize = (size_t)&local_90;
  }
  else {
    local_c8._M_h._M_rehash_policy._M_next_resize = (size_t)local_120;
  }
  local_90 = local_110;
  local_118 = 0;
  local_110 = local_110 & 0xffffffffffffff00;
  local_80 = 0;
  local_140 = (size_type *)&local_130;
  local_120 = &local_110;
  local_c8._M_h._M_buckets._0_4_ = (int)headers;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&local_68);
  HVar4.__handle_ = local_d0.__handle_;
  local_78 = 0;
  uStack_70 = 0;
  async_request<std::__cxx11::string,std::__cxx11::string>
            ((coro_http_client *)local_d0.__handle_,local_d8,(http_method)&local_f8,
             (req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x3,&local_c8,(span<char,_18446744073709551615UL>)ZEXT816(0));
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  if ((ulong *)local_c8._M_h._M_rehash_policy._M_next_resize != &local_90) {
    operator_delete((void *)local_c8._M_h._M_rehash_policy._M_next_resize,local_90 + 1);
  }
  if ((size_type *)local_c8._M_h._M_bucket_count != psVar3) {
    operator_delete((void *)local_c8._M_h._M_bucket_count,local_c8._M_h._M_element_count + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120,local_110 + 1);
  }
  if (local_140 != (size_type *)&local_130) {
    operator_delete(local_140,CONCAT44(uStack_12c,local_130) + 1);
  }
  return (Lazy<cinatra::resp_data>)HVar4.__handle_;
}

Assistant:

async_simple::coro::Lazy<resp_data> async_post(
      std::string uri, std::string content, req_content_type content_type,
      std::unordered_map<std::string, std::string> headers = {}) {
    req_context<> ctx{content_type, "", std::move(content)};
    return async_request(std::move(uri), http_method::POST, std::move(ctx),
                         std::move(headers));
  }